

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * make_D3D_destarg_string(Context *ctx,char *buf,size_t buflen)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  size_t in_R8;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char writemask_str [6];
  char pred [32];
  char regnum_str [16];
  
  uVar5 = (ctx->dest_arg).result_shift - 1;
  pcVar10 = "";
  if (uVar5 < 0xf) {
    pcVar10 = &DAT_00152bb0 + *(int *)(&DAT_00152bb0 + (ulong)uVar5 * 4);
  }
  uVar5 = (ctx->dest_arg).result_mod;
  pcVar8 = "_sat";
  if ((uVar5 & 1) == 0) {
    pcVar8 = "";
  }
  pcVar9 = "_pp";
  if ((uVar5 & 2) == 0) {
    pcVar9 = "";
  }
  pcVar6 = "_centroid";
  if ((uVar5 & 4) == 0) {
    pcVar6 = "";
  }
  pcVar3 = get_D3D_register_string
                     (ctx,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum,regnum_str,in_R8);
  if (pcVar3 == (char *)0x0) {
    failf(ctx,"%s","Unknown destination register type.");
    *buf = '\0';
  }
  else {
    iVar2 = isscalar(ctx,ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
    if ((iVar2 == 0) && ((ctx->dest_arg).writemask != 0xf)) {
      writemask_str[0] = '.';
      if ((ctx->dest_arg).writemask0 == 0) {
        lVar4 = 1;
      }
      else {
        writemask_str[1] = 'x';
        lVar4 = 2;
      }
      if ((ctx->dest_arg).writemask1 != 0) {
        writemask_str[lVar4] = 'y';
        lVar4 = lVar4 + 1;
      }
      if ((ctx->dest_arg).writemask2 != 0) {
        writemask_str[lVar4] = 'z';
        lVar4 = lVar4 + 1;
      }
      if ((ctx->dest_arg).writemask3 != 0) {
        writemask_str[lVar4] = 'w';
        lVar4 = lVar4 + 1;
      }
    }
    else {
      lVar4 = 0;
    }
    writemask_str[lVar4] = '\0';
    pred[0x10] = '\0';
    pred[0x11] = '\0';
    pred[0x12] = '\0';
    pred[0x13] = '\0';
    pred[0x14] = '\0';
    pred[0x15] = '\0';
    pred[0x16] = '\0';
    pred[0x17] = '\0';
    pred[0x18] = '\0';
    pred[0x19] = '\0';
    pred[0x1a] = '\0';
    pred[0x1b] = '\0';
    pred[0x1c] = '\0';
    pred[0x1d] = '\0';
    pred[0x1e] = '\0';
    pred[0x1f] = '\0';
    pred[0] = '\0';
    pred[1] = '\0';
    pred[2] = '\0';
    pred[3] = '\0';
    pred[4] = '\0';
    pred[5] = '\0';
    pred[6] = '\0';
    pred[7] = '\0';
    pred[8] = '\0';
    pred[9] = '\0';
    pred[10] = '\0';
    pred[0xb] = '\0';
    pred[0xc] = '\0';
    pred[0xd] = '\0';
    pred[0xe] = '\0';
    pred[0xf] = '\0';
    if (ctx->predicated == 0) {
      pcVar1 = ")\n";
      pcVar7 = "";
    }
    else {
      make_D3D_srcarg_string_in_buf(ctx,&ctx->predicate_arg,pred,0x20);
      pcVar7 = ") ";
      pcVar1 = ") (";
    }
    snprintf(buf,0x40,"%s%s%s%s %s%s%s%s%s%s",pcVar10,pcVar8,pcVar9,pcVar6,pcVar1 + 2,pred,pcVar7,
             pcVar3,regnum_str,writemask_str);
  }
  return buf;
}

Assistant:

static const char *make_D3D_destarg_string(Context *ctx, char *buf,
                                           const size_t buflen)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    const char *result_shift_str = "";
    switch (arg->result_shift)
    {
        case 0x1: result_shift_str = "_x2"; break;
        case 0x2: result_shift_str = "_x4"; break;
        case 0x3: result_shift_str = "_x8"; break;
        case 0xD: result_shift_str = "_d8"; break;
        case 0xE: result_shift_str = "_d4"; break;
        case 0xF: result_shift_str = "_d2"; break;
    } // switch

    const char *sat_str = (arg->result_mod & MOD_SATURATE) ? "_sat" : "";
    const char *pp_str = (arg->result_mod & MOD_PP) ? "_pp" : "";
    const char *cent_str = (arg->result_mod & MOD_CENTROID) ? "_centroid" : "";

    char regnum_str[16];
    const char *regtype_str = get_D3D_register_string(ctx, arg->regtype,
                                                      arg->regnum, regnum_str,
                                                      sizeof (regnum_str));
    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown destination register type.");
        *buf = '\0';
        return buf;
    } // if

    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    const char *pred_left = "";
    const char *pred_right = "";
    char pred[32] = { '\0' };
    if (ctx->predicated)
    {
        pred_left = "(";
        pred_right = ") ";
        make_D3D_srcarg_string_in_buf(ctx, &ctx->predicate_arg,
                                      pred, sizeof (pred));
    } // if

    // may turn out something like "_x2_sat_pp_centroid (!p0.x) r0.xyzw" ...
    snprintf(buf, buflen, "%s%s%s%s %s%s%s%s%s%s",
             result_shift_str, sat_str, pp_str, cent_str,
             pred_left, pred, pred_right,
             regtype_str, regnum_str, writemask_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}